

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O2

void __thiscall
WellFounded::addRule(WellFounded *this,BoolView *hl,vec<BoolView> *posb,vec<BoolView> *negb)

{
  vec<BoolView>::push(&this->raw_heads,hl);
  vec<vec<BoolView>_>::push(&this->raw_posb);
  vec<BoolView>::copyTo(posb,(this->raw_posb).data + ((this->raw_posb).sz - 1));
  vec<vec<BoolView>_>::push(&this->raw_negb);
  vec<BoolView>::copyTo(negb,(this->raw_negb).data + ((this->raw_negb).sz - 1));
  vec<BoolView>::push(&this->raw_bl,&bv_false);
  return;
}

Assistant:

void addRule(const BoolView& hl, vec<BoolView>& posb, vec<BoolView>& negb) {
		raw_heads.push(hl);
		raw_posb.push();
		posb.copyTo(raw_posb.last());
		raw_negb.push();
		negb.copyTo(raw_negb.last());
		raw_bl.push(bv_false);
	}